

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::CheckerDataDeclarationSyntax::setChild
          (CheckerDataDeclarationSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  long in_RSI;
  long in_RDI;
  Token TVar2;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_ffffffffffffffa8;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_ffffffffffffffb0;
  DataDeclarationSyntax *local_30;
  not_null<slang::syntax::DataDeclarationSyntax_*> local_28;
  undefined8 local_20;
  Info *local_18;
  
  if (in_RSI == 0) {
    pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x37892c);
    SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>>(pSVar1);
    SyntaxList<slang::syntax::AttributeInstanceSyntax>::operator=
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  else if (in_RSI == 1) {
    TVar2 = ConstTokenOrSyntax::token((ConstTokenOrSyntax *)in_stack_ffffffffffffffa8);
    local_20 = TVar2._0_8_;
    *(undefined8 *)(in_RDI + 0x50) = local_20;
    local_18 = TVar2.info;
    *(Info **)(in_RDI + 0x58) = local_18;
  }
  else {
    pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x378984);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_30 = (DataDeclarationSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x378994);
      local_30 = SyntaxNode::as<slang::syntax::DataDeclarationSyntax>(pSVar1);
    }
    not_null<slang::syntax::DataDeclarationSyntax_*>::
    not_null<slang::syntax::DataDeclarationSyntax_*>(&local_28,&local_30);
    *(DataDeclarationSyntax **)(in_RDI + 0x60) = local_28.ptr;
  }
  return;
}

Assistant:

void CheckerDataDeclarationSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: rand = child.token(); return;
        case 2: data = child.node() ? &child.node()->as<DataDeclarationSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}